

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_reflection.cc
# Opt level: O2

void __thiscall
google::protobuf::Reflection::SetEnumValue
          (Reflection *this,Message *message,FieldDescriptor *field,int value)

{
  CppType CVar1;
  EnumDescriptor *this_00;
  EnumValueDescriptor *pEVar2;
  UnknownFieldSet *this_01;
  
  if (*(Descriptor **)(field + 0x50) != this->descriptor_) {
    anon_unknown_0::ReportReflectionUsageError
              (this->descriptor_,field,"SetEnumValue","Field does not match message type.");
  }
  if (*(int *)(field + 0x3c) == 3) {
    anon_unknown_0::ReportReflectionUsageError
              (this->descriptor_,field,"SetEnumValue",
               "Field is repeated; the method requires a singular field.");
  }
  CVar1 = FieldDescriptor::cpp_type(field);
  if (CVar1 != CPPTYPE_ENUM) {
    anon_unknown_0::ReportReflectionUsageTypeError
              (this->descriptor_,field,"SetEnumValue",CPPTYPE_ENUM);
  }
  if (*(int *)(*(long *)(this->descriptor_ + 0x10) + 0x3c) != 3) {
    this_00 = FieldDescriptor::enum_type(field);
    pEVar2 = EnumDescriptor::FindValueByNumber(this_00,value);
    if (pEVar2 == (EnumValueDescriptor *)0x0) {
      this_01 = MutableUnknownFields(this,message);
      UnknownFieldSet::AddVarint(this_01,*(int *)(field + 0x44),(long)value);
      return;
    }
  }
  SetEnumValueInternal(this,message,field,value);
  return;
}

Assistant:

void Reflection::SetEnumValue(Message* message, const FieldDescriptor* field,
                              int value) const {
  USAGE_CHECK_ALL(SetEnumValue, SINGULAR, ENUM);
  if (!CreateUnknownEnumValues(descriptor_->file())) {
    // Check that the value is valid if we don't support direct storage of
    // unknown enum values.
    const EnumValueDescriptor* value_desc =
        field->enum_type()->FindValueByNumber(value);
    if (value_desc == nullptr) {
      MutableUnknownFields(message)->AddVarint(field->number(), value);
      return;
    }
  }
  SetEnumValueInternal(message, field, value);
}